

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingregistry.cpp
# Opt level: O3

QList<QLoggingRule> *
loadRulesFromFile(QList<QLoggingRule> *__return_storage_ptr__,QString *filePath)

{
  int *piVar1;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  int __oflag;
  char *pcVar5;
  long in_FS_OFFSET;
  QMessageLogger local_98;
  QTextStream local_78;
  QFile local_68;
  QArrayDataPointer<QLoggingRule> local_58;
  QLoggingSettingsParser local_40;
  QList<QLoggingRule> *local_20;
  
  local_20 = *(QList<QLoggingRule> **)(in_FS_OFFSET + 0x28);
  bVar3 = qtLoggingDebug();
  if (bVar3) {
    local_40.m_inRulesSection = true;
    local_40._1_3_ = 0;
    local_40._4_4_ = 0;
    local_40._rules.d.d._0_4_ = 0;
    local_40._rules.d.d._4_4_ = 0;
    local_40._rules.d.ptr._0_4_ = 0;
    local_40._rules.d.ptr._4_4_ = 0;
    local_40._rules.d.size = 0x4caba3;
    QDir::toNativeSeparators(filePath);
    QString::toUtf8_helper((QByteArray *)&local_98,(QString *)&local_58);
    pcVar5 = (char *)CONCAT44(local_98.context.file._4_4_,local_98.context.file._0_4_);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = &QByteArray::_empty;
    }
    QMessageLogger::debug((QMessageLogger *)&local_40,"Checking \"%s\" for rules",pcVar5);
    piVar1 = (int *)CONCAT44(local_98.context.line,local_98.context.version);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_98.context.line,local_98.context.version),1,0x10);
      }
    }
    if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
      }
    }
  }
  local_68.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_68.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
       (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile(&local_68,filePath);
  iVar4 = QFile::open(&local_68,(char *)0x11,__oflag);
  if ((char)iVar4 == '\0') {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QLoggingRule *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    local_78._vptr_QTextStream = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d_ptr._M_t.
    super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
    super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
    super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
         (__uniq_ptr_data<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>,_true,_true>)
         &DAT_aaaaaaaaaaaaaaaa;
    QTextStream::QTextStream(&local_78,(QIODevice *)&local_68);
    local_40._4_4_ = 0xaaaaaaaa;
    local_40.m_inRulesSection = false;
    local_40._1_3_ = 0xaaaaaa;
    local_40._rules.d.d._0_4_ = 0;
    local_40._rules.d.d._4_4_ = 0;
    local_40._rules.d.ptr._0_4_ = 0;
    local_40._rules.d.ptr._4_4_ = 0;
    local_40._rules.d.size = 0;
    QLoggingSettingsParser::setContent(&local_40,&local_78);
    bVar3 = qtLoggingDebug();
    if (bVar3) {
      local_98.context.version = 2;
      local_98.context.line = 0;
      local_98.context.file._0_4_ = 0;
      local_98.context.file._4_4_ = 0;
      local_98.context.function._0_4_ = 0;
      local_98.context.function._4_4_ = 0;
      local_98.context.category = "qt.core.logging";
      local_58.d = (Data *)CONCAT44(local_40._rules.d.d._4_4_,local_40._rules.d.d._0_4_);
      local_58.ptr = (QLoggingRule *)
                     CONCAT44(local_40._rules.d.ptr._4_4_,local_40._rules.d.ptr._0_4_);
      local_58.size = local_40._rules.d.size;
      if ((QArrayData *)local_58.d != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_58.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QMessageLogger::debug(&local_98,"Loaded %td rules",local_40._rules.d.size);
      QArrayDataPointer<QLoggingRule>::~QArrayDataPointer(&local_58);
    }
    pDVar2 = (Data *)CONCAT44(local_40._rules.d.d._4_4_,local_40._rules.d.d._0_4_);
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr =
         (QLoggingRule *)CONCAT44(local_40._rules.d.ptr._4_4_,local_40._rules.d.ptr._0_4_);
    (__return_storage_ptr__->d).size = local_40._rules.d.size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QArrayDataPointer<QLoggingRule>::~QArrayDataPointer(&local_40._rules.d);
    QTextStream::~QTextStream(&local_78);
  }
  QFile::~QFile(&local_68);
  if (*(QList<QLoggingRule> **)(in_FS_OFFSET + 0x28) == local_20) {
    return *(QList<QLoggingRule> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QList<QLoggingRule> loadRulesFromFile(const QString &filePath)
{
    if (qtLoggingDebug()) {
        debugMsg("Checking \"%s\" for rules",
                 QDir::toNativeSeparators(filePath).toUtf8().constData());
    }

    QFile file(filePath);
    if (file.open(QIODevice::ReadOnly | QIODevice::Text)) {
        QTextStream stream(&file);
        QLoggingSettingsParser parser;
        parser.setContent(stream);
        if (qtLoggingDebug())
            debugMsg("Loaded %td rules", static_cast<ptrdiff_t>(parser.rules().size()));
        return parser.rules();
    }
    return QList<QLoggingRule>();
}